

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O2

string * __thiscall
CLI::Option::get_type_name_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  pointer pVVar1;
  pointer this_00;
  string vtype;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator()(__return_storage_ptr__,&this->type_name_);
  this_00 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pVVar1) {
    for (; this_00 != pVVar1; this_00 = this_00 + 1) {
      Validator::get_description_abi_cxx11_(&local_70,this_00);
      if (local_70._M_string_length != 0) {
        ::std::operator+(&local_50,":",&local_70);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string Option::get_type_name() const {
    std::string full_type_name = type_name_();
    if(!validators_.empty()) {
        for(const auto &Validator : validators_) {
            std::string vtype = Validator.get_description();
            if(!vtype.empty()) {
                full_type_name += ":" + vtype;
            }
        }
    }
    return full_type_name;
}